

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_traits.h
# Opt level: O3

void cppcms::details::
     archive_load_container<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *v,archive *a)

{
  iterator iVar1;
  const_iterator __position;
  ulong uVar2;
  size_t n;
  value_type tmp;
  ulong local_60;
  _Alloc_node local_58;
  string local_50;
  
  cppcms::archive::read_chunk(a,(ulong)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&v->_M_t);
  if (local_60 != 0) {
    __position._M_node = (v->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar2 = 0;
    do {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      archive_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::load(&local_50,a);
      local_58._M_t = &v->_M_t;
      iVar1 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::
              _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)v,__position,&local_50,&local_58);
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_60);
  }
  return;
}

Assistant:

void archive_load_container(T &v,archive &a)
		{
			size_t n;
			archive_traits<size_t>::load(n,a);
			v.clear();
			std::insert_iterator<T> it(v,v.begin());
			typedef typename T::value_type value_type;
			for(size_t i=0;i<n;i++) {
				value_type tmp;
				archive_traits<value_type>::load(tmp,a);
				*it++ = tmp;
			}
		}